

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

void ZSTD_initFseState(ZSTD_fseState *DStatePtr,BIT_DStream_t *bitD,ZSTD_seqSymbol *dt)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  size_t *psVar4;
  void *ptr;
  uint uVar5;
  
  uVar1 = dt->baseValue;
  if (0x1f < uVar1) {
    __assert_fail("nbBits < BIT_MASK_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                  ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
  }
  uVar5 = bitD->bitsConsumed + uVar1;
  bitD->bitsConsumed = uVar5;
  DStatePtr->state = ~(-1L << ((byte)uVar1 & 0x3f)) & bitD->bitContainer >> (-(char)uVar5 & 0x3fU);
  if (uVar5 < 0x41) {
    pcVar2 = bitD->ptr;
    if (pcVar2 < bitD->limitPtr) {
      pcVar3 = bitD->start;
      if (pcVar2 == pcVar3) goto LAB_002299d0;
      uVar1 = (int)pcVar2 - (int)pcVar3;
      if (pcVar3 <= pcVar2 + -(ulong)(uVar5 >> 3)) {
        uVar1 = uVar5 >> 3;
      }
      psVar4 = (size_t *)(pcVar2 + -(ulong)uVar1);
      bitD->ptr = (char *)psVar4;
      uVar5 = uVar5 + uVar1 * -8;
    }
    else {
      psVar4 = (size_t *)(pcVar2 + -(ulong)(uVar5 >> 3));
      bitD->ptr = (char *)psVar4;
      uVar5 = uVar5 & 7;
    }
    bitD->bitsConsumed = uVar5;
    bitD->bitContainer = *psVar4;
  }
LAB_002299d0:
  DStatePtr->table = dt + 1;
  return;
}

Assistant:

static void
ZSTD_initFseState(ZSTD_fseState* DStatePtr, BIT_DStream_t* bitD, const ZSTD_seqSymbol* dt)
{
    const void* ptr = dt;
    const ZSTD_seqSymbol_header* const DTableH = (const ZSTD_seqSymbol_header*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    DEBUGLOG(6, "ZSTD_initFseState : val=%u using %u bits",
                (U32)DStatePtr->state, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}